

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> * __thiscall
cfd::core::Psbt::GetTxInSignaturePubkeyList
          (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__return_storage_ptr__,
          Psbt *this,uint32_t index)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  size_type __n;
  bool bVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78 [24];
  Pubkey pubkey;
  ByteData key;
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xa91,"GetTxInSignaturePubkeyList");
  pvVar1 = this->wally_psbt_pointer_;
  __n = *(size_type *)(*(long *)((long)pvVar1 + 0x10) + 0x68 + (ulong)index * 0x110);
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::reserve
            (__return_storage_ptr__,__n);
  lVar3 = 8;
  while (bVar4 = __n != 0, __n = __n - 1, bVar4) {
    lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x10) + 0x60 + (ulong)index * 0x110);
    ByteData::ByteData(&key,*(uint8_t **)(lVar2 + -8 + lVar3),*(uint32_t *)(lVar2 + lVar3));
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (local_78,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
    Pubkey::Pubkey(&pubkey,(ByteData *)local_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    ::std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>::
    emplace_back<cfd::core::Pubkey&>
              ((vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>> *)__return_storage_ptr__
               ,&pubkey);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
    lVar3 = lVar3 + 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Pubkey> Psbt::GetTxInSignaturePubkeyList(uint32_t index) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  size_t key_max = psbt_pointer->inputs[index].signatures.num_items;
  std::vector<Pubkey> arr;
  arr.reserve(key_max);
  struct wally_map_item *item;
  for (size_t key_index = 0; key_index < key_max; ++key_index) {
    item = &psbt_pointer->inputs[index].signatures.items[key_index];
    ByteData key(item->key, static_cast<uint32_t>(item->key_len));
    Pubkey pubkey(key);
    arr.emplace_back(pubkey);
  }
  return arr;
}